

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVMOVSRR(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t uVar2;
  uint32_t Val;
  uint32_t uVar3;
  uint RegNo_01;
  DecodeStatus DVar4;
  uint pred;
  uint Rm;
  uint Rt2;
  uint Rt;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  Rt2 = 3;
  _Rt = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Insn,0xc,4);
  RegNo_00 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,5,1);
  Val = fieldFromInstruction_4(Address_local._4_4_,0x1c,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0,4);
  RegNo_01 = uVar3 << 1 | uVar2;
  if (((RegNo == 0xf) || (RegNo_00 == 0xf)) || (RegNo_01 == 0x1f)) {
    Rt2 = 1;
  }
  DVar4 = DecodeSPRRegisterClass(pMStack_18,RegNo_01,(uint64_t)Decoder_local,_Rt);
  _Var1 = Check(&Rt2,DVar4);
  if (_Var1) {
    DVar4 = DecodeSPRRegisterClass(pMStack_18,RegNo_01 + 1,(uint64_t)Decoder_local,_Rt);
    _Var1 = Check(&Rt2,DVar4);
    if (_Var1) {
      DVar4 = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rt);
      _Var1 = Check(&Rt2,DVar4);
      if (_Var1) {
        DVar4 = DecodeGPRRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_Rt);
        _Var1 = Check(&Rt2,DVar4);
        if (_Var1) {
          DVar4 = DecodePredicateOperand(pMStack_18,Val,(uint64_t)Decoder_local,_Rt);
          _Var1 = Check(&Rt2,DVar4);
          if (_Var1) {
            Inst_local._4_4_ = Rt2;
          }
          else {
            Inst_local._4_4_ = MCDisassembler_Fail;
          }
        }
        else {
          Inst_local._4_4_ = MCDisassembler_Fail;
        }
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeVMOVSRR(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rt  = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rt2 = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm  = fieldFromInstruction_4(Insn,  5, 1);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	Rm |= fieldFromInstruction_4(Insn, 0, 4) << 1;

	if (Rt == 0xF || Rt2 == 0xF || Rm == 0x1F)
		S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeSPRRegisterClass(Inst, Rm  , Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeSPRRegisterClass(Inst, Rm+1, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt  , Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt2 , Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}